

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

GLFWbool chooseGLXFBConfig(_GLFWfbconfig *desired,GLXFBConfig *result)

{
  GLXFBConfig fbconfig;
  bool bVar1;
  int iVar2;
  uint uVar3;
  GLFWbool GVar4;
  char *__s1;
  _GLFWfbconfig *p_Var5;
  XVisualInfo *pXVar6;
  XVisualInfo *vi;
  _GLFWfbconfig *u;
  GLXFBConfig n;
  GLFWbool trustWindowBit;
  char *vendor;
  int local_40;
  int usableCount;
  int nativeCount;
  int i;
  _GLFWfbconfig *closest;
  _GLFWfbconfig *usableConfigs;
  GLXFBConfig *nativeConfigs;
  GLXFBConfig *result_local;
  _GLFWfbconfig *desired_local;
  
  bVar1 = true;
  nativeConfigs = result;
  result_local = (GLXFBConfig *)desired;
  __s1 = (*_glfw.glx.GetClientString)(_glfw.x11.display,1);
  if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,"Chromium"), iVar2 == 0)) {
    bVar1 = false;
  }
  usableConfigs =
       (_GLFWfbconfig *)(*_glfw.glx.GetFBConfigs)(_glfw.x11.display,_glfw.x11.screen,&local_40);
  if ((usableConfigs == (_GLFWfbconfig *)0x0) || (local_40 == 0)) {
    _glfwInputError(0x10006,"GLX: No GLXFBConfigs returned");
    desired_local._4_4_ = 0;
  }
  else {
    closest = (_GLFWfbconfig *)calloc((long)local_40,0x48);
    vendor._4_4_ = 0;
    for (usableCount = 0; usableCount < local_40; usableCount = usableCount + 1) {
      fbconfig = *(GLXFBConfig *)(&usableConfigs->redBits + (long)usableCount * 2);
      p_Var5 = closest + (int)vendor._4_4_;
      uVar3 = getGLXFBConfigAttrib(fbconfig,0x8011);
      if (((uVar3 & 1) != 0) &&
         (((uVar3 = getGLXFBConfigAttrib(fbconfig,0x8010), (uVar3 & 1) != 0 || (!bVar1)) &&
          (iVar2 = getGLXFBConfigAttrib(fbconfig,5), iVar2 == *(int *)(result_local + 7))))) {
        if ((*(int *)((long)result_local + 0x3c) != 0) &&
           (pXVar6 = (*_glfw.glx.GetVisualFromFBConfig)(_glfw.x11.display,fbconfig),
           pXVar6 != (XVisualInfo *)0x0)) {
          GVar4 = _glfwIsVisualTransparentX11(pXVar6->visual);
          p_Var5->transparent = GVar4;
          XFree(pXVar6);
        }
        iVar2 = getGLXFBConfigAttrib(fbconfig,8);
        p_Var5->redBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,9);
        p_Var5->greenBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,10);
        p_Var5->blueBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,0xb);
        p_Var5->alphaBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,0xc);
        p_Var5->depthBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,0xd);
        p_Var5->stencilBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,0xe);
        p_Var5->accumRedBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,0xf);
        p_Var5->accumGreenBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,0x10);
        p_Var5->accumBlueBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,0x11);
        p_Var5->accumAlphaBits = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,7);
        p_Var5->auxBuffers = iVar2;
        iVar2 = getGLXFBConfigAttrib(fbconfig,6);
        if (iVar2 != 0) {
          p_Var5->stereo = 1;
        }
        if (_glfw.glx.ARB_multisample != 0) {
          iVar2 = getGLXFBConfigAttrib(fbconfig,0x186a1);
          p_Var5->samples = iVar2;
        }
        if ((_glfw.glx.ARB_framebuffer_sRGB != 0) || (_glfw.glx.EXT_framebuffer_sRGB != 0)) {
          iVar2 = getGLXFBConfigAttrib(fbconfig,0x20b2);
          p_Var5->sRGB = iVar2;
        }
        p_Var5->handle = (uintptr_t)fbconfig;
        vendor._4_4_ = vendor._4_4_ + 1;
      }
    }
    _nativeCount = _glfwChooseFBConfig((_GLFWfbconfig *)result_local,closest,vendor._4_4_);
    if (_nativeCount != (_GLFWfbconfig *)0x0) {
      *nativeConfigs = (GLXFBConfig)_nativeCount->handle;
    }
    XFree(usableConfigs);
    free(closest);
    desired_local._4_4_ = (uint)(_nativeCount != (_GLFWfbconfig *)0x0);
  }
  return desired_local._4_4_;
}

Assistant:

static GLFWbool chooseGLXFBConfig(const _GLFWfbconfig* desired,
                                  GLXFBConfig* result)
{
    GLXFBConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;
    const char* vendor;
    GLFWbool trustWindowBit = GLFW_TRUE;

    // HACK: This is a (hopefully temporary) workaround for Chromium
    //       (VirtualBox GL) not setting the window bit on any GLXFBConfigs
    vendor = glXGetClientString(_glfw.x11.display, GLX_VENDOR);
    if (vendor && strcmp(vendor, "Chromium") == 0)
        trustWindowBit = GLFW_FALSE;

    nativeConfigs =
        glXGetFBConfigs(_glfw.x11.display, _glfw.x11.screen, &nativeCount);
    if (!nativeConfigs || !nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "GLX: No GLXFBConfigs returned");
        return GLFW_FALSE;
    }

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const GLXFBConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGBA GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_RENDER_TYPE) & GLX_RGBA_BIT))
            continue;

        // Only consider window GLXFBConfigs
        if (!(getGLXFBConfigAttrib(n, GLX_DRAWABLE_TYPE) & GLX_WINDOW_BIT))
        {
            if (trustWindowBit)
                continue;
        }

        if (getGLXFBConfigAttrib(n, GLX_DOUBLEBUFFER) != desired->doublebuffer)
            continue;

        if (desired->transparent)
        {
            XVisualInfo* vi = glXGetVisualFromFBConfig(_glfw.x11.display, n);
            if (vi)
            {
                u->transparent = _glfwIsVisualTransparentX11(vi->visual);
                XFree(vi);
            }
        }

        u->redBits = getGLXFBConfigAttrib(n, GLX_RED_SIZE);
        u->greenBits = getGLXFBConfigAttrib(n, GLX_GREEN_SIZE);
        u->blueBits = getGLXFBConfigAttrib(n, GLX_BLUE_SIZE);

        u->alphaBits = getGLXFBConfigAttrib(n, GLX_ALPHA_SIZE);
        u->depthBits = getGLXFBConfigAttrib(n, GLX_DEPTH_SIZE);
        u->stencilBits = getGLXFBConfigAttrib(n, GLX_STENCIL_SIZE);

        u->accumRedBits = getGLXFBConfigAttrib(n, GLX_ACCUM_RED_SIZE);
        u->accumGreenBits = getGLXFBConfigAttrib(n, GLX_ACCUM_GREEN_SIZE);
        u->accumBlueBits = getGLXFBConfigAttrib(n, GLX_ACCUM_BLUE_SIZE);
        u->accumAlphaBits = getGLXFBConfigAttrib(n, GLX_ACCUM_ALPHA_SIZE);

        u->auxBuffers = getGLXFBConfigAttrib(n, GLX_AUX_BUFFERS);

        if (getGLXFBConfigAttrib(n, GLX_STEREO))
            u->stereo = GLFW_TRUE;

        if (_glfw.glx.ARB_multisample)
            u->samples = getGLXFBConfigAttrib(n, GLX_SAMPLES);

        if (_glfw.glx.ARB_framebuffer_sRGB || _glfw.glx.EXT_framebuffer_sRGB)
            u->sRGB = getGLXFBConfigAttrib(n, GLX_FRAMEBUFFER_SRGB_CAPABLE_ARB);

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (GLXFBConfig) closest->handle;

    XFree(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}